

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateData.cpp
# Opt level: O1

void __thiscall amrex::StateData::printTimeInterval(StateData *this,ostream *os)

{
  ostream *poVar1;
  char local_1d [5];
  
  local_1d[0] = '[';
  std::__ostream_insert<char,std::char_traits<char>>(os,local_1d,1);
  poVar1 = std::ostream::_M_insert<double>((this->old_time).start);
  local_1d[1] = 0x20;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_1d + 1,1);
  poVar1 = std::ostream::_M_insert<double>((this->old_time).stop);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"] [",3);
  poVar1 = std::ostream::_M_insert<double>((this->new_time).start);
  local_1d[2] = 0x20;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_1d + 2,1);
  poVar1 = std::ostream::_M_insert<double>((this->new_time).stop);
  local_1d[3] = 0x5d;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_1d + 3,1);
  local_1d[4] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_1d + 4,1);
  return;
}

Assistant:

void
StateData::printTimeInterval (std::ostream &os) const
{
    os << '['
       << old_time.start
       << ' '
       << old_time.stop
       << "] ["
       << new_time.start
       << ' '
       << new_time.stop
       << ']'
       << '\n';
}